

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CNetAddr::GetInAddr(CNetAddr *this,in_addr *pipv4Addr)

{
  Network NVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  NVar1 = this->m_net;
  if (NVar1 == NET_IPV4) {
    uVar2 = (this->m_addr)._size;
    uVar4 = uVar2 - 0x11;
    if (uVar2 < 0x11) {
      uVar4 = uVar2;
    }
    if (uVar4 != 4) {
      __assert_fail("sizeof(*pipv4Addr) == m_addr.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                    ,0x277,"bool CNetAddr::GetInAddr(struct in_addr *) const");
    }
    if (0x10 < uVar2) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    pipv4Addr->s_addr = *(in_addr_t *)&(this->m_addr)._union;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return NVar1 == NET_IPV4;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::GetInAddr(struct in_addr* pipv4Addr) const
{
    if (!IsIPv4())
        return false;
    assert(sizeof(*pipv4Addr) == m_addr.size());
    memcpy(pipv4Addr, m_addr.data(), m_addr.size());
    return true;
}